

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O0

void small_suite::test_zero(void)

{
  reference pvVar1;
  undefined4 local_7c [2];
  undefined4 local_74;
  size_type local_70;
  undefined4 local_64;
  size_type local_60 [3];
  undefined1 local_48 [8];
  encoder_type encoder;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::detail::basic_encoder<24ul>::
  basic_encoder<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_encoder<24ul> *)local_48,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  local_60[0] = trial::protocol::bintoken::detail::basic_encoder<24UL>::value
                          ((basic_encoder<24UL> *)local_48,'\0');
  local_64 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::int8_t(0))","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x66,"void small_suite::test_zero()",local_60,&local_64);
  local_70 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  local_74 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("buffer.size()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x67,"void small_suite::test_zero()",&local_70,&local_74);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20,0);
  local_7c[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[0]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x68,"void small_suite::test_zero()",pvVar1,local_7c);
  trial::protocol::bintoken::detail::basic_encoder<24UL>::~basic_encoder
            ((basic_encoder<24UL> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> buffer;
    encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::int8_t(0)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer[0], 0x00);
}